

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O2

void duckdb::Leaf::DeprecatedVacuum(ART *art,Node *node)

{
  bool bVar1;
  FixedSizeAllocator *this;
  IndexPointer IVar2;
  Leaf *pLVar3;
  
  this = Node::GetAllocator(art,LEAF);
  while (IVar2.data = (node->super_IndexPointer).data, 0xffffffffffffff < IVar2.data) {
    bVar1 = FixedSizeAllocator::NeedsVacuum(this,IVar2);
    IVar2.data = (node->super_IndexPointer).data;
    if (bVar1) {
      IVar2 = FixedSizeAllocator::VacuumPointer(this,IVar2);
      IVar2.data = IVar2.data & 0xffffffffffffff | 0x200000000000000;
      (node->super_IndexPointer).data = IVar2.data;
    }
    pLVar3 = Node::Ref<duckdb::Leaf>(art,(Node)IVar2.data,LEAF);
    node = &pLVar3->ptr;
  }
  return;
}

Assistant:

void Leaf::DeprecatedVacuum(ART &art, Node &node) {
	D_ASSERT(node.HasMetadata());
	D_ASSERT(node.GetType() == LEAF);

	auto &allocator = Node::GetAllocator(art, LEAF);
	reference<Node> ref(node);
	while (ref.get().HasMetadata()) {
		if (allocator.NeedsVacuum(ref)) {
			ref.get() = allocator.VacuumPointer(ref);
			ref.get().SetMetadata(static_cast<uint8_t>(LEAF));
		}
		auto &leaf = Node::Ref<Leaf>(art, ref, LEAF);
		ref = leaf.ptr;
	}
}